

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprkstep.c
# Opt level: O1

int sprkStep_TakeStep_Compensated(ARKodeMem ark_mem,sunrealtype *dsmPtr,int *nflagPtr)

{
  double dVar1;
  double dVar2;
  long *plVar3;
  N_Vector p_Var4;
  N_Vector p_Var5;
  N_Vector p_Var6;
  bool bVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  int local_6c;
  
  plVar3 = (long *)ark_mem->step_mem;
  if (plVar3 == (long *)0x0) {
    iVar8 = -0x15;
    arkProcessError(ark_mem,-0x15,0x2e8,"sprkStep_TakeStep_Compensated",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_sprkstep.c"
                    ,"Time step module memory is NULL.");
  }
  else {
    p_Var4 = ark_mem->tempv1;
    p_Var5 = ark_mem->tempv2;
    p_Var6 = ark_mem->tempv3;
    N_VConst(0,p_Var4);
    dVar11 = 0.0;
    lVar9 = *plVar3;
    if (0 < *(int *)(lVar9 + 4)) {
      lVar10 = 0;
      dVar12 = 0.0;
      do {
        dVar1 = *(double *)(*(long *)(lVar9 + 8) + lVar10 * 8);
        dVar2 = *(double *)(*(long *)(lVar9 + 0x10) + lVar10 * 8);
        dVar12 = dVar12 + dVar1;
        dVar11 = dVar11 + dVar2;
        *(int *)(plVar3 + 8) = (int)lVar10;
        N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,ark_mem->yn,p_Var4,p_Var5);
        N_VConst(0,plVar3[2]);
        iVar8 = (*(code *)plVar3[4])
                          (ark_mem->h * dVar11 + ark_mem->tn,p_Var5,plVar3[2],ark_mem->user_data);
        plVar3[6] = plVar3[6] + 1;
        if (iVar8 == 0) {
          N_VLinearSum(0x3ff0000000000000,dVar2 * ark_mem->h,p_Var4,plVar3[2],p_Var4);
          N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,ark_mem->yn,p_Var4,p_Var5);
          ark_mem->tcur = ark_mem->h * dVar11 + ark_mem->tn;
          N_VConst(0,plVar3[2]);
          iVar8 = (*(code *)plVar3[5])
                            (ark_mem->h * dVar12 + ark_mem->tn,p_Var5,plVar3[2],ark_mem->user_data);
          plVar3[7] = plVar3[7] + 1;
          if (iVar8 != 0) goto LAB_0014bed6;
          N_VLinearSum(0x3ff0000000000000,dVar1 * ark_mem->h,p_Var4,plVar3[2],p_Var4);
          if (ark_mem->ProcessStage == (ARKPostProcessFn)0x0) {
            bVar7 = true;
          }
          else {
            bVar7 = false;
            local_6c = -0x26;
            arkProcessError(ark_mem,-0x26,0x2a4,"sprkStep_TakeStep_Compensated",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_sprkstep.c"
                            ,"Compensated summation is not compatible with stage PostProcessing!\n")
            ;
          }
        }
        else {
LAB_0014bed6:
          bVar7 = false;
          local_6c = -8;
        }
        if (!bVar7) {
          return local_6c;
        }
        lVar10 = lVar10 + 1;
        lVar9 = *plVar3;
      } while (lVar10 < *(int *)(lVar9 + 4));
    }
    N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,p_Var4,plVar3[3],p_Var4);
    N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,ark_mem->yn,p_Var4,ark_mem->ycur);
    N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,ark_mem->ycur,ark_mem->yn,p_Var6);
    N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,p_Var6,p_Var4,plVar3[3]);
    *nflagPtr = 0;
    *dsmPtr = 0.0;
    iVar8 = 0;
  }
  return iVar8;
}

Assistant:

int sprkStep_TakeStep_Compensated(ARKodeMem ark_mem, sunrealtype* dsmPtr,
                                  int* nflagPtr)
{
  ARKodeSPRKStepMem step_mem = NULL;
  N_Vector delta_Yi          = NULL;
  N_Vector yn_plus_delta_Yi  = NULL;
  N_Vector diff              = NULL;
  sunrealtype ci             = SUN_RCONST(0.0);
  sunrealtype chati          = SUN_RCONST(0.0);
  int is                     = 0;
  int retval                 = 0;

  /* access ARKodeSPRKStepMem structure */
  retval = sprkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Vector shortcuts */
  delta_Yi         = ark_mem->tempv1;
  yn_plus_delta_Yi = ark_mem->tempv2;
  diff             = ark_mem->tempv3;

  /* [ \Delta P_0 ] = [ 0 ]
     [ \Delta Q_0 ] = [ 0 ] */
  N_VConst(ZERO, delta_Yi);

  /* loop over internal stages to the step */
  for (is = 0; is < step_mem->method->stages; is++)
  {
    /* load/compute coefficients */
    sunrealtype ai    = step_mem->method->a[is];
    sunrealtype ahati = step_mem->method->ahat[is];

    ci += ai;
    chati += ahati;

    /* store current stage index */
    step_mem->istage = is;

    /* [     ] + [            ]
       [ q_n ] + [ \Delta Q_i ] */
    N_VLinearSum(ONE, ark_mem->yn, ONE, delta_Yi, yn_plus_delta_Yi);

    /* Evaluate p' with the previous velocity */
    N_VConst(ZERO, step_mem->sdata); /* either have to do this or ask user to
                                        set other outputs to zero */
    retval = sprkStep_f1(step_mem, ark_mem->tn + chati * ark_mem->h,
                         yn_plus_delta_Yi, step_mem->sdata, ark_mem->user_data);
    if (retval != 0) { return (ARK_RHSFUNC_FAIL); }

    /* Incremental position update:
       [ \Delta P_i ] = [ \Delta P_{i-1} ] + [ sdata ]
       [            ] = [                ] + [       ] */
    N_VLinearSum(ONE, delta_Yi, ark_mem->h * ahati, step_mem->sdata, delta_Yi);

    /* [ p_n ] + [ \Delta P_i ]
       [     ] + [            ] */
    N_VLinearSum(ONE, ark_mem->yn, ONE, delta_Yi, yn_plus_delta_Yi);

    /* set current stage time(s) */
    ark_mem->tcur = ark_mem->tn + chati * ark_mem->h;

    /* Evaluate q' with the current positions */
    N_VConst(ZERO, step_mem->sdata); /* either have to do this or ask user to
                                        set other outputs to zero */
    retval = sprkStep_f2(step_mem, ark_mem->tn + ci * ark_mem->h,
                         yn_plus_delta_Yi, step_mem->sdata, ark_mem->user_data);
    if (retval != 0) { return (ARK_RHSFUNC_FAIL); }

    /* Incremental velocity update:
       [            ] = [                ] + [       ]
       [ \Delta Q_i ] = [ \Delta Q_{i-1} ] + [ sdata ] */
    N_VLinearSum(ONE, delta_Yi, ark_mem->h * ai, step_mem->sdata, delta_Yi);

    /* if user-supplied stage postprocessing function, we error out since it
     * wont work with the increment form */
    if (ark_mem->ProcessStage != NULL)
    {
      arkProcessError(ark_mem, ARK_POSTPROCESS_STAGE_FAIL, __LINE__, __func__,
                      __FILE__,
                      "Compensated summation is not compatible with stage "
                      "PostProcessing!\n");
      return (ARK_POSTPROCESS_STAGE_FAIL);
    }
  }

  /*
    Now we compute the step solution via compensated summation.
     [ p_{n+1} ] = [ p_n ] + [ \Delta P_i ]
     [ q_{n+1} ] = [ q_n ] + [ \Delta Q_i ] */
  N_VLinearSum(ONE, delta_Yi, -ONE, step_mem->yerr, delta_Yi);
  N_VLinearSum(ONE, ark_mem->yn, ONE, delta_Yi, ark_mem->ycur);
  N_VLinearSum(ONE, ark_mem->ycur, -ONE, ark_mem->yn, diff);
  N_VLinearSum(ONE, diff, -ONE, delta_Yi, step_mem->yerr);

  *nflagPtr = 0;
  *dsmPtr   = SUN_RCONST(0.0);

  return 0;
}